

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qc_file.c
# Opt level: O1

QcFile * qc_file_open(char *pathname,int oflag)

{
  int iVar1;
  QcFile *pQVar2;
  int __whence;
  size_t __nbytes;
  size_t __n;
  undefined4 in_register_00000034;
  void *__buf;
  stat sStack_e0;
  
  __buf = (void *)CONCAT44(in_register_00000034,oflag);
  if (pathname != (char *)0x0) {
    pQVar2 = (QcFile *)malloc(4);
    if (pQVar2 == (QcFile *)0x0) {
      _qc_error("/workspace/llm4binary/github/license_all_cmakelists_1510/zhanglw-dev[P]queue-c/src/qc_rt/qc_file.c"
                ,0x35,"file hdl malloc failed");
      pQVar2 = (QcFile *)0x0;
    }
    else {
      if ((oflag & 0x40U) == 0) {
        iVar1 = open(pathname,oflag);
      }
      else {
        iVar1 = open(pathname,oflag,0x1c0);
      }
      pQVar2->filedes = iVar1;
      if (iVar1 == -1) {
        pQVar2 = (QcFile *)0x0;
        _qc_perror("/workspace/llm4binary/github/license_all_cmakelists_1510/zhanglw-dev[P]queue-c/src/qc_rt/qc_file.c"
                   ,0x44,"file(pathname) open failed",pathname);
      }
    }
    return pQVar2;
  }
  qc_file_open_cold_1();
  if ((int *)pathname != (int *)0x0) {
    iVar1 = close(*(int *)pathname);
    if (iVar1 == 0) {
      free(pathname);
      pQVar2 = (QcFile *)0x0;
    }
    else {
      _qc_error("/workspace/llm4binary/github/license_all_cmakelists_1510/zhanglw-dev[P]queue-c/src/qc_rt/qc_file.c"
                ,0x52,"file close failed");
      pQVar2 = (QcFile *)0xffffffff;
    }
    return pQVar2;
  }
  qc_file_close_cold_1();
  if ((int *)pathname != (int *)0x0) {
    pQVar2 = (QcFile *)read(*(int *)pathname,__buf,__nbytes);
    return pQVar2;
  }
  qc_file_read_cold_1();
  if ((int *)pathname != (int *)0x0) {
    pQVar2 = (QcFile *)write(*(int *)pathname,__buf,__n);
    return pQVar2;
  }
  qc_file_write_cold_1();
  if ((int *)pathname != (int *)0x0) {
    iVar1 = fsync(*(int *)pathname);
    if (iVar1 == 0) {
      pQVar2 = (QcFile *)0x0;
    }
    else {
      _qc_error("/workspace/llm4binary/github/license_all_cmakelists_1510/zhanglw-dev[P]queue-c/src/qc_rt/qc_file.c"
                ,0x83,"file sync failed");
      pQVar2 = (QcFile *)0xffffffff;
    }
    return pQVar2;
  }
  qc_file_sync_cold_1();
  if ((int *)pathname != (int *)0x0) {
    pQVar2 = (QcFile *)lseek(*(int *)pathname,(__off_t)__buf,__whence);
    if ((long)pQVar2 < 0) {
      _qc_error("/workspace/llm4binary/github/license_all_cmakelists_1510/zhanglw-dev[P]queue-c/src/qc_rt/qc_file.c"
                ,0x94,"file seek failed");
      pQVar2 = (QcFile *)0xffffffffffffffff;
    }
    return pQVar2;
  }
  qc_file_seek_cold_1();
  if ((int *)pathname != (int *)0x0) {
    pQVar2 = (QcFile *)lseek(*(int *)pathname,0,1);
    if ((long)pQVar2 < 0) {
      _qc_error("/workspace/llm4binary/github/license_all_cmakelists_1510/zhanglw-dev[P]queue-c/src/qc_rt/qc_file.c"
                ,0xa5,"file tell failed");
      pQVar2 = (QcFile *)0xffffffffffffffff;
    }
    return pQVar2;
  }
  qc_file_tell_cold_1();
  if ((int *)pathname != (int *)0x0) {
    sStack_e0.__unused[2] = 0x106fd1;
    iVar1 = access(pathname,0);
    return (QcFile *)(ulong)-(uint)(iVar1 != 0);
  }
  sStack_e0.__unused[2] = (long)qc_file_size;
  qc_file_exist_cold_1();
  iVar1 = stat(pathname,&sStack_e0);
  pQVar2 = (QcFile *)0xffffffffffffffff;
  if (-1 < iVar1) {
    pQVar2 = (QcFile *)sStack_e0.st_size;
  }
  return pQVar2;
}

Assistant:

QcFile* qc_file_open(const char *pathname, int oflag)
{
    QcFile *file;
    int mode;

    qc_assert(pathname);

    if(NULL == (file = malloc(sizeof(QcFile))))
    {
        qc_error("file hdl malloc failed");
        return NULL;
    }

    if(O_CREAT & oflag)
    {
        file->filedes = open(pathname, oflag, S_IRUSR|S_IWUSR|S_IXUSR);
    }
    else
    {
        file->filedes = open(pathname, oflag);
    }

    if(-1 == file->filedes)
    {
        qc_perror("file(pathname) open failed", pathname);
        return NULL;
    }

    return file;
}